

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ExprList_item *pEVar1;
  byte *pbVar2;
  WhereTerm **ppWVar3;
  ushort uVar4;
  Parse *pParse;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint op;
  int iVar9;
  int iVar10;
  Expr *pEVar11;
  WhereTerm *pWVar12;
  CollSeq *pCVar13;
  CollSeq *pCVar14;
  Expr *pA;
  Bitmask BVar15;
  byte bVar16;
  byte bVar17;
  short sVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  undefined6 in_register_00000082;
  ulong uVar26;
  Index *pIVar27;
  anon_struct_4_9_b482b7ef_for_fg *paVar28;
  ulong uVar29;
  ExprList_item *pEVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  WhereLoop *local_108;
  char local_fc;
  uint local_bc;
  ulong local_a0;
  ulong local_80;
  
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) ||
     ((pWInfo->pParse->db->dbOptFlags & 0x40) == 0)) {
    uVar4 = (ushort)pOrderBy->nExpr;
    uVar33 = (ulong)uVar4;
    uVar25 = 0;
    if (uVar4 < 0x40) {
      uVar8 = (uint)wctrlFlags;
      op = 0x183 - ((wctrlFlags & 0x803) == 0);
      uVar19 = ~(-1L << ((byte)uVar4 & 0x3f));
      pEVar1 = pOrderBy->a;
      bVar7 = true;
      uVar25 = 0;
      local_108 = (WhereLoop *)0x0;
      uVar26 = 0;
      local_80 = 0;
      local_a0 = 0;
LAB_001ad836:
      if (((!bVar7) || (uVar19 <= uVar26)) || (nLoop < uVar25)) goto LAB_001adf2a;
      if (uVar25 != 0) {
        local_a0 = local_a0 | local_108->maskSelf;
      }
      local_108 = pLast;
      if ((nLoop <= uVar25) || (local_108 = pPath->aLoop[uVar25], (wctrlFlags >> 0xb & 1) == 0)) {
        if ((local_108->wsFlags & 0x400) != 0) {
          uVar25 = uVar19;
          if ((local_108->u).vtab.isOrdered == '\0') {
            uVar25 = uVar26;
          }
          if ((uVar8 & 0x280) != 0x80) {
            uVar26 = uVar25;
          }
LAB_001adf2a:
          uVar25 = uVar33;
          if ((uVar26 != uVar19) && (uVar25 = 0xff, !bVar7)) {
            do {
              if ((long)uVar33 < 2) goto LAB_001adf5f;
              uVar33 = uVar33 - 1;
              uVar25 = uVar33;
            } while ((-1L << ((byte)uVar33 & 0x3f) | uVar26) != 0xffffffffffffffff);
          }
          goto LAB_001adf62;
        }
        local_fc = (char)wctrlFlags;
        if (local_fc < '\0') {
          (local_108->u).btree.nDistinctCol = 0;
        }
        iVar10 = pWInfo->pTabList->a[local_108->iTab].iCursor;
        for (uVar20 = 0; uVar21 = 1, uVar20 != uVar33; uVar20 = uVar20 + 1) {
          if ((uVar26 >> (uVar20 & 0x3f) & 1) == 0) {
            pEVar11 = sqlite3ExprSkipCollateAndLikely(pEVar1[uVar20].pExpr);
            if ((((pEVar11 != (Expr *)0x0) && ((pEVar11->op == 0xa9 || (pEVar11->op == 0xa7)))) &&
                (pEVar11->iTable == iVar10)) &&
               (pWVar12 = sqlite3WhereFindTerm
                                    (&pWInfo->sWC,iVar10,(int)pEVar11->iColumn,~local_a0,op,
                                     (Index *)0x0), pWVar12 != (WhereTerm *)0x0)) {
              if (pWVar12->eOperator == 1) {
                uVar21 = 0;
                do {
                  if (local_108->nLTerm == uVar21) goto LAB_001ada2e;
                  ppWVar3 = local_108->aLTerm + uVar21;
                  uVar21 = uVar21 + 1;
                } while (pWVar12 != *ppWVar3);
              }
              if (((pWVar12->eOperator & 0x82) != 0) && (-1 < pEVar11->iColumn)) {
                pParse = pWInfo->pParse;
                pCVar13 = sqlite3ExprNNCollSeq(pParse,pEVar1[uVar20].pExpr);
                pCVar14 = sqlite3ExprCompareCollSeq(pParse,pWVar12->pExpr);
                if ((pCVar14 == (CollSeq *)0x0) ||
                   (iVar9 = sqlite3StrICmp(pCVar13->zName,pCVar14->zName), iVar9 != 0))
                goto LAB_001ada2e;
              }
              uVar26 = uVar26 | 1L << ((byte)uVar20 & 0x3f);
            }
          }
LAB_001ada2e:
        }
        uVar32 = local_108->wsFlags;
        if ((uVar32 >> 0xc & 1) == 0) {
          if ((uVar32 >> 8 & 1) == 0) {
            pIVar27 = (local_108->u).btree.pIndex;
            if ((pIVar27 == (Index *)0x0) || ((pIVar27->field_0x63 & 4) != 0)) goto LAB_001adf5f;
            local_bc = (uint)pIVar27->nKeyCol;
            bVar7 = -1 < (short)uVar32 && pIVar27->onError != '\0';
            uVar20 = (ulong)pIVar27->nColumn;
          }
          else {
            pIVar27 = (Index *)0x0;
            local_bc = 0;
            uVar20 = uVar21;
          }
          uVar31 = 0;
          bVar6 = false;
          bVar17 = 0;
          bVar5 = false;
LAB_001adae4:
          if (uVar31 != uVar20) {
            uVar29 = (ulong)(local_108->u).btree.nEq;
            if ((uVar29 <= uVar31) || (uVar31 < local_108->nSkip)) {
LAB_001adb08:
              uVar32 = 1;
LAB_001adb0b:
              if (pIVar27 == (Index *)0x0) {
                bVar24 = 0;
                uVar22 = 0xffffffff;
              }
              else {
                sVar18 = pIVar27->aiColumn[uVar31];
                bVar24 = pIVar27->aSortOrder[uVar31] & 1;
                if (sVar18 == pIVar27->pTable->iPKey) {
                  sVar18 = -1;
                }
                uVar22 = (uint)sVar18;
                if (bVar7) {
                  if (sVar18 < 0) {
                    bVar7 = sVar18 == -2;
                  }
                  else {
                    bVar7 = true;
                    if (uVar31 < uVar29) goto LAB_001adbda;
                    bVar7 = (pIVar27->pTable->aCol[uVar22].field_0x8 & 0xf) == 0;
                  }
                  bVar7 = !bVar7;
                }
                else {
                  bVar7 = false;
                }
              }
LAB_001adbda:
              uVar29 = 0;
              paVar28 = &pOrderBy->a[0].fg;
              do {
                if (((char)uVar32 == '\0') || (uVar33 <= uVar29)) goto LAB_001ade07;
                if ((uVar26 >> (uVar29 & 0x3f) & 1) == 0) {
                  pEVar11 = ((ExprList_item *)(paVar28 + -4))->pExpr;
                  pA = sqlite3ExprSkipCollateAndLikely(pEVar11);
                  if (pA != (Expr *)0x0) {
                    if ((wctrlFlags & 0xc0) == 0) {
                      uVar32 = uVar8 & 0xc0;
                    }
                    if ((int)uVar22 < -1) {
                      iVar9 = sqlite3ExprCompareSkip(pA,pIVar27->aColExpr->a[uVar31].pExpr,iVar10);
                      if (iVar9 == 0) {
                        pEVar11 = ((ExprList_item *)(paVar28 + -4))->pExpr;
                        goto LAB_001adca9;
                      }
                    }
                    else if ((((pA->op == 0xa9) || (pA->op == 0xa7)) && (pA->iTable == iVar10)) &&
                            (uVar22 == (int)pA->iColumn)) {
                      if (uVar22 == 0xffffffff) goto LAB_001add1a;
LAB_001adca9:
                      pCVar13 = sqlite3ExprNNCollSeq(pWInfo->pParse,pEVar11);
                      iVar9 = sqlite3StrICmp(pCVar13->zName,pIVar27->azColl[uVar31]);
                      if (iVar9 == 0) goto LAB_001add1a;
                    }
                  }
                }
                uVar29 = uVar29 + 1;
                paVar28 = paVar28 + 6;
              } while( true );
            }
            pWVar12 = local_108->aLTerm[uVar31];
            uVar4 = pWVar12->eOperator;
            if ((op & uVar4) == 0) {
              if ((uVar4 & 1) == 0) goto LAB_001adb08;
              uVar23 = uVar21;
              do {
                if (uVar29 <= uVar23) goto LAB_001adb08;
                ppWVar3 = local_108->aLTerm + uVar23;
                uVar23 = uVar23 + 1;
                uVar32 = 0;
              } while ((*ppWVar3)->pExpr != pWVar12->pExpr);
              goto LAB_001adb0b;
            }
            if ((uVar4 & 0x180) != 0) {
              bVar7 = false;
            }
            goto LAB_001addfc;
          }
LAB_001ade31:
          if (!bVar6 && !bVar7) {
            bVar7 = false;
            goto LAB_001adee9;
          }
        }
        local_80 = local_80 | local_108->maskSelf;
        pEVar30 = pEVar1;
        for (uVar20 = 0; uVar33 != uVar20; uVar20 = uVar20 + 1) {
          uVar21 = 1L << ((byte)uVar20 & 0x3f);
          if ((uVar26 >> (uVar20 & 0x3f) & 1) == 0) {
            pEVar11 = pEVar30->pExpr;
            BVar15 = sqlite3WhereExprUsage(&pWInfo->sMaskSet,pEVar11);
            if ((BVar15 != 0) || (iVar10 = sqlite3ExprIsConstant(pEVar11), iVar10 != 0)) {
              if ((~local_80 & BVar15) != 0) {
                uVar21 = 0;
              }
              uVar26 = uVar26 | uVar21;
            }
          }
          pEVar30 = pEVar30 + 1;
        }
        bVar7 = true;
      }
LAB_001adee9:
      uVar25 = uVar25 + 1;
      goto LAB_001ad836;
    }
  }
  else {
LAB_001adf5f:
    uVar25 = 0;
  }
LAB_001adf62:
  return (i8)uVar25;
LAB_001add1a:
  if (local_fc < '\0') {
    (local_108->u).btree.nDistinctCol = (short)uVar31 + 1;
  }
  if ((char)((uVar8 & 0x40) >> 6) == '\0' && uVar29 < uVar33) {
    if (bVar5) {
      bVar5 = true;
      if ((bVar24 ^ bVar17) != (paVar28->sortFlags & 1)) goto LAB_001ade07;
    }
    else {
      bVar16 = paVar28->sortFlags & 1;
      bVar17 = bVar16 ^ bVar24;
      bVar5 = true;
      if (bVar16 != bVar24) {
        *pRevMask = *pRevMask | 1L << ((byte)uVar25 & 0x3f);
      }
    }
  }
  if ((paVar28->sortFlags & 2) != 0) {
    if (uVar31 != (local_108->u).btree.nEq) {
LAB_001ade07:
      if ((uint)uVar31 < local_bc) {
        bVar7 = false;
      }
      if (uVar31 == 0) {
        bVar7 = false;
      }
      goto LAB_001ade31;
    }
    pbVar2 = (byte *)((long)&local_108->wsFlags + 2);
    *pbVar2 = *pbVar2 | 8;
  }
  if (uVar22 == 0xffffffff) {
    bVar6 = true;
  }
  uVar26 = uVar26 | 1L << (uVar29 & 0x3f);
LAB_001addfc:
  uVar31 = uVar31 + 1;
  uVar21 = uVar21 + 1;
  goto LAB_001adae4;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & (WHERE_ORDERBY_LIMIT|WHERE_ORDERBY_MAX|WHERE_ORDERBY_MIN) ){
    eqOpMask |= WO_IN;
  }
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered
       && ((wctrlFlags&(WHERE_DISTINCTBY|WHERE_SORTBYGROUP))!=WHERE_DISTINCTBY)
      ){
        obSat = obDone;
      }
      break;
    }else if( wctrlFlags & WHERE_DISTINCTBY ){
      pLoop->u.btree.nDistinctCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollateAndLikely(pOrderBy->a[i].pExpr);
      if( NEVER(pOBExpr==0) ) continue;
      if( pOBExpr->op!=TK_COLUMN && pOBExpr->op!=TK_AGG_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags &
               (WHERE_ORDERBY_LIMIT|WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX) );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        Parse *pParse = pWInfo->pParse;
        CollSeq *pColl1 = sqlite3ExprNNCollSeq(pParse, pOrderBy->a[i].pExpr);
        CollSeq *pColl2 = sqlite3ExprCompareCollSeq(pParse, pTerm->pExpr);
        assert( pColl1 );
        if( pColl2==0 || sqlite3StrICmp(pColl1->zName, pColl2->zName) ){
          continue;
        }
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        /* All relevant terms of the index must also be non-NULL in order
        ** for isOrderDistinct to be true.  So the isOrderDistint value
        ** computed here might be a false positive.  Corrections will be
        ** made at tag-20210426-1 below */
        isOrderDistinct = IsUniqueIndex(pIndex)
                          && (pLoop->wsFlags & WHERE_SKIPSCAN)==0;
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing).  Except, IS and ISNULL
          ** terms imply that the index is not UNIQUE NOT NULL in which case
          ** the loop need to be marked as not order-distinct because it can
          ** have repeated NULL rows.
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...))
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.
          */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & (WO_ISNULL|WO_IS) ){
              testcase( eOp & WO_ISNULL );
              testcase( eOp & WO_IS );
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j] & KEYINFO_ORDER_DESC;
          if( iColumn==pIndex->pTable->iPKey ) iColumn = XN_ROWID;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered.  tag-20210426-1
        */
        if( isOrderDistinct ){
          if( iColumn>=0
           && j>=pLoop->u.btree.nEq
           && pIndex->pTable->aCol[iColumn].notNull==0
          ){
            isOrderDistinct = 0;
          }
          if( iColumn==XN_EXPR ){
            isOrderDistinct = 0;
          }
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollateAndLikely(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( NEVER(pOBExpr==0) ) continue;
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=XN_ROWID ){
            if( pOBExpr->op!=TK_COLUMN && pOBExpr->op!=TK_AGG_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            Expr *pIdxExpr = pIndex->aColExpr->a[j].pExpr;
            if( sqlite3ExprCompareSkip(pOBExpr, pIdxExpr, iCur) ){
              continue;
            }
          }
          if( iColumn!=XN_ROWID ){
            pColl = sqlite3ExprNNCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          if( wctrlFlags & WHERE_DISTINCTBY ){
            pLoop->u.btree.nDistinctCol = j+1;
          }
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)
                           != (pOrderBy->a[i].fg.sortFlags&KEYINFO_ORDER_DESC)
            ){
              isMatch = 0;
            }
          }else{
            rev = revIdx ^ (pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_DESC);
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch && (pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_BIGNULL) ){
          if( j==pLoop->u.btree.nEq ){
            pLoop->wsFlags |= WHERE_BIGNULL_SORT;
          }else{
            isMatch = 0;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = ALWAYS(i<BMS) ? MASKBIT(i) - 1 : 0;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}